

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall libtorrent::bt_peer_connection::write_extensions(bt_peer_connection *this)

{
  _Atomic_word *p_Var1;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *plVar2;
  mutex_type *pmVar3;
  int iVar4;
  undefined4 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  session_interface *psVar7;
  session_settings *psVar8;
  ulong uVar9;
  pointer pcVar10;
  socket_type *s;
  byte bVar11;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int val_1;
  int iVar23;
  data_type dVar24;
  uint uVar25;
  entry *peVar26;
  dictionary_type *this_00;
  string *psVar27;
  short *psVar28;
  mapped_type *pmVar29;
  time_t tVar30;
  integer_type *piVar31;
  _Base_ptr p_Var32;
  element_type *this_01;
  integer_type v;
  _List_node_base *p_Var33;
  _Rb_tree_header *p_Var34;
  bool bVar35;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  span<const_char> buf;
  span<const_char> buf_00;
  set<int,_std::less<int>,_std::allocator<int>_> ext;
  string remote_address;
  vector<char,_std::allocator<char>_> dict_msg;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  entry handshake;
  int val;
  char msg [6];
  undefined1 local_150 [8];
  undefined1 local_148 [8];
  undefined1 auStack_140 [24];
  size_t local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [16];
  long local_e8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  entry local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [32];
  undefined4 local_38;
  undefined2 local_34;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  undefined4 extraout_var;
  
  entry::entry(&local_d0);
  key.len_ = 1;
  key.ptr_ = "m";
  peVar26 = entry::operator[](&local_d0,key);
  this_00 = entry::dict_abi_cxx11_(peVar26);
  p_Var6 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_01 = (torrent *)0x0;
    local_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_01 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_weak_count = p_Var6->_M_weak_count + 1;
    }
    iVar23 = p_Var6->_M_use_count;
    do {
      if (iVar23 == 0) {
        local_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_01 = (element_type *)0x0;
        goto LAB_0021bf39;
      }
      LOCK();
      iVar4 = p_Var6->_M_use_count;
      bVar35 = iVar23 == iVar4;
      if (bVar35) {
        p_Var6->_M_use_count = iVar23 + 1;
        iVar4 = iVar23;
      }
      iVar23 = iVar4;
      UNLOCK();
    } while (!bVar35);
    local_120 = p_Var6;
    if (p_Var6->_M_use_count == 0) {
      this_01 = (element_type *)0x0;
    }
LAB_0021bf39:
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var6->_M_weak_count;
      iVar23 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar23 = p_Var6->_M_weak_count;
      p_Var6->_M_weak_count = iVar23 + -1;
    }
    if (iVar23 == 1) {
      (*p_Var6->_vptr__Sp_counted_base[3])();
    }
  }
  if (((this->super_peer_connection).field_0x761 & 8) != 0) {
    psVar7 = (this->super_peer_connection).super_peer_connection_hot_members.m_ses;
    uVar5 = *(undefined4 *)&this_01->field_0x5c4;
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x13])
              (&local_118,this);
    if ((short)local_118._M_dataplus._M_p != 2) {
      auStack_140._1_7_ = local_118.field_2._M_allocated_capacity._1_7_;
      auStack_140[0] = local_118.field_2._M_local_buf[0];
      local_148 = (undefined1  [8])local_118._M_string_length;
      auStack_140._8_8_ = ZEXT48((uint)local_118.field_2._8_4_);
      local_118._M_dataplus._M_p._4_4_ = 0;
    }
    else {
      _local_148 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
      auStack_140._8_8_ = 0;
    }
    local_150._1_3_ = 0;
    local_150[0] = (short)local_118._M_dataplus._M_p != 2;
    local_150._4_4_ = local_118._M_dataplus._M_p._4_4_;
    iVar23 = (*(psVar7->super_session_logger)._vptr_session_logger[0x22])
                       (psVar7,(ulong)((byte)((uint)uVar5 >> 0x19) & 1));
    if (iVar23 != 0) {
      key_00.len_ = 1;
      key_00.ptr_ = "p";
      peVar26 = entry::operator[](&local_d0,key_00);
      entry::operator=(peVar26,(long)iVar23);
    }
  }
  psVar8 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
  local_150 = (undefined1  [8])&psVar8->m_mutex;
  auVar19[0xf] = 0;
  auVar19._0_15_ = stack0xfffffffffffffeb9;
  _local_148 = (anon_union_16_3_a3f0114d_for___in6_u)(auVar19 << 8);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_150);
  local_148[0] = 1;
  uVar9 = (psVar8->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_150);
  if ((uVar9 >> 0x26 & 1) == 0) {
    psVar27 = aux::session_settings::get_str_abi_cxx11_
                        ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                         3);
    psVar27 = aux::session_settings::get_str_abi_cxx11_
                        ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                         (uint)(psVar27->_M_string_length != 0) * 3);
    pcVar10 = (psVar27->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar10,pcVar10 + psVar27->_M_string_length);
    key_01.len_ = 1;
    key_01.ptr_ = "v";
    peVar26 = entry::operator[](&local_d0,key_01);
    entry::operator=(peVar26,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_d8.container = &local_118;
  iVar23 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x12])
                     (this);
  psVar28 = (short *)CONCAT44(extraout_var,iVar23);
  if (*psVar28 != 2) {
    _local_148 = *(anon_union_16_3_a3f0114d_for___in6_u *)(psVar28 + 4);
    auStack_140._8_8_ = ZEXT48(*(uint *)(psVar28 + 0xc));
    local_150._4_4_ = 0;
  }
  else {
    local_150._4_4_ = *(undefined4 *)(psVar28 + 2);
    _local_148 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
    auStack_140._8_8_ = 0;
  }
  local_150._1_3_ = 0;
  local_150[0] = *psVar28 != 2;
  detail::write_address<std::back_insert_iterator<std::__cxx11::string>&>
            ((address *)local_150,&local_d8);
  s = (this->super_peer_connection).m_socket.
      super___shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (this->super_peer_connection).m_socket.
           super___shared_ptr<libtorrent::aux::socket_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  bVar35 = aux::is_i2p(s);
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if (!bVar35) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    key_02.len_ = 6;
    key_02.ptr_ = "yourip";
    peVar26 = entry::operator[](&local_d0,key_02);
    entry::operator=(peVar26,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  psVar8 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
  local_150 = (undefined1  [8])&psVar8->m_mutex;
  auVar20[0xf] = 0;
  auVar20._0_15_ = stack0xfffffffffffffeb9;
  _local_148 = (anon_union_16_3_a3f0114d_for___in6_u)(auVar20 << 8);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_150);
  local_148[0] = 1;
  iVar23 = (psVar8->m_store).m_ints._M_elems[7];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_150);
  key_03.len_ = 4;
  key_03.ptr_ = "reqq";
  peVar26 = entry::operator[](&local_d0,key_03);
  entry::operator=(peVar26,(long)iVar23);
  pmVar3 = (mutex_type *)(local_148 + 8);
  local_150 = (undefined1  [8])pmVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"upload_only","");
  pmVar29 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>_>
            ::operator[](this_00,(key_type *)local_150);
  entry::operator=(pmVar29,3);
  if (local_150 != (undefined1  [8])pmVar3) {
    operator_delete((void *)local_150,auStack_140._0_8_ + 1);
  }
  local_150 = (undefined1  [8])pmVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"ut_holepunch","");
  pmVar29 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>_>
            ::operator[](this_00,(key_type *)local_150);
  entry::operator=(pmVar29,4);
  if (local_150 != (undefined1  [8])pmVar3) {
    operator_delete((void *)local_150,auStack_140._0_8_ + 1);
  }
  psVar8 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
  local_150 = (undefined1  [8])&psVar8->m_mutex;
  auVar21[0xf] = 0;
  auVar21._0_15_ = stack0xfffffffffffffeb9;
  _local_148 = (anon_union_16_3_a3f0114d_for___in6_u)(auVar21 << 8);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_150);
  local_148[0] = 1;
  uVar9 = (psVar8->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_150);
  if ((uVar9 >> 0x35 & 1) != 0) {
    local_150 = (undefined1  [8])pmVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"share_mode","");
    pmVar29 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>_>
              ::operator[](this_00,(key_type *)local_150);
    entry::operator=(pmVar29,8);
    if (local_150 != (undefined1  [8])pmVar3) {
      operator_delete((void *)local_150,auStack_140._0_8_ + 1);
    }
  }
  local_150 = (undefined1  [8])pmVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"lt_donthave","");
  pmVar29 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>_>
            ::operator[](this_00,(key_type *)local_150);
  entry::operator=(pmVar29,7);
  if (local_150 != (undefined1  [8])pmVar3) {
    operator_delete((void *)local_150,auStack_140._0_8_ + 1);
  }
  if (this_01->m_last_seen_complete < 1) {
    v = -1;
  }
  else {
    tVar30 = time((time_t *)0x0);
    v = (integer_type)((int)tVar30 - (int)this_01->m_last_seen_complete);
  }
  key_04.len_ = 0xc;
  key_04.ptr_ = "complete_ago";
  peVar26 = entry::operator[](&local_d0,key_04);
  entry::operator=(peVar26,v);
  bVar35 = torrent::is_finished(this_01);
  uVar9 = *(ulong *)&(this_01->super_torrent_hot_members).field_0x38;
  if (((((byte)(uVar9 >> 0x18) >> 5 & 1) == 0 && (~bVar35 & (uVar9 & 0x81000000) == 0) == 0) &&
      (0 < (((this_01->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_files).m_piece_length)) && ((this_01->field_0x5b0 & 8) == 0)) {
    key_05.len_ = 0xb;
    key_05.ptr_ = "upload_only";
    peVar26 = entry::operator[](&local_d0,key_05);
    entry::operator=(peVar26,1);
  }
  psVar8 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
  local_150 = (undefined1  [8])&psVar8->m_mutex;
  auVar22[0xf] = 0;
  auVar22._0_15_ = stack0xfffffffffffffeb9;
  _local_148 = (anon_union_16_3_a3f0114d_for___in6_u)(auVar22 << 8);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_150);
  local_148[0] = 1;
  uVar9 = (psVar8->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_150);
  if (((uVar9 & 0x20000000000000) != 0) &&
     (((this_01->super_torrent_hot_members).field_0x3b & 0x20) != 0)) {
    key_06.len_ = 10;
    key_06.ptr_ = "share_mode";
    peVar26 = entry::operator[](&local_d0,key_06);
    entry::operator=(peVar26,1);
  }
  plVar2 = &(this->super_peer_connection).m_extensions;
  p_Var33 = (_List_node_base *)plVar2;
  while (p_Var33 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                      *)&p_Var33->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var33 != (_List_node_base *)plVar2) {
    (**(code **)(*(long *)p_Var33[1]._M_next + 0x18))(p_Var33[1]._M_next,&local_d0);
  }
  auStack_140._8_8_ = local_148;
  local_148 = (undefined1  [8])(local_148._4_8_ << 0x20);
  auStack_140._0_8_ = 0;
  local_128 = 0;
  p_Var32 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var34 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
  auStack_140._16_8_ = auStack_140._8_8_;
  if ((_Rb_tree_header *)p_Var32 != p_Var34) {
    do {
      dVar24 = entry::type((entry *)(p_Var32 + 2));
      if (dVar24 == int_t) {
        piVar31 = entry::integer((entry *)(p_Var32 + 2));
        local_58._0_4_ = (int)*piVar31;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   local_150,(int *)local_58);
      }
      p_Var32 = (_Base_ptr)std::_Rb_tree_increment(p_Var32);
    } while ((_Rb_tree_header *)p_Var32 != p_Var34);
  }
  local_58._0_8_ = local_f8;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = 0;
  detail::bencode_recursive<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)local_58,&local_d0);
  p_Var6 = local_120;
  uVar25 = (local_f8._8_4_ - local_f8._0_4_) + 2;
  uVar16 = (ushort)((uVar25 & 0xff00ff) >> 0x10);
  uVar17 = (ushort)(uVar25 >> 8) & 0xff;
  uVar18 = (ushort)(uVar25 & 0xff00ff);
  bVar11 = (byte)(uVar25 >> 0x18);
  uVar15 = (ushort)bVar11;
  bVar11 = (uVar15 != 0) * (uVar15 < 0x100) * bVar11 - (0xff < uVar15);
  bVar12 = ((uVar25 & 0xff0000) != 0) * (uVar16 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < uVar16);
  bVar13 = ((uVar25 & 0xff00) != 0) * (uVar17 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar17);
  bVar14 = ((uVar25 & 0xff) != 0) * (uVar18 < 0x100) * (char)uVar25 - (0xff < uVar18);
  local_38 = CONCAT13((bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14),
                      CONCAT12((bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13),
                               CONCAT11((bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12),
                                        (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11))
                              ));
  local_34 = 0x14;
  buf.m_len = 6;
  buf.m_ptr = (char *)&local_38;
  peer_connection::send_buffer(&this->super_peer_connection,buf);
  buf_00.m_len = local_f8._8_8_ - local_f8._0_8_;
  buf_00.m_ptr = (char *)local_f8._0_8_;
  peer_connection::send_buffer(&this->super_peer_connection,buf_00);
  counters::inc_stats_counter((this->super_peer_connection).m_counters,0x65,1);
  bVar35 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
  if (bVar35) {
    entry::to_string_abi_cxx11_((string *)local_58,&local_d0,true);
    peer_connection::peer_log
              (&this->super_peer_connection,outgoing_message,"EXTENDED_HANDSHAKE","%s",
               local_58._0_8_);
    if ((vector<char,_std::allocator<char>_> *)local_58._0_8_ !=
        (vector<char,_std::allocator<char>_> *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
    }
  }
  if ((void *)local_f8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_e8 - local_f8._0_8_);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  entry::~entry(&local_d0);
  return;
}

Assistant:

void bt_peer_connection::write_extensions()
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(m_supports_extensions);
		TORRENT_ASSERT(m_sent_handshake);

		entry handshake;
		entry::dictionary_type& m = handshake["m"].dict();

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		// if we're using a proxy, our listen port won't be useful
		// anyway.
		if (is_outgoing())
		{
			auto const port = m_ses.listen_port(
				t->is_ssl_torrent() ? aux::transport::ssl : aux::transport::plaintext
				, local_endpoint().address());
			if (port != 0) handshake["p"] = port;
		}

		// only send the port in case we bade the connection
		// on incoming connections the other end already knows
		// our listen port
		if (!m_settings.get_bool(settings_pack::anonymous_mode))
		{
			handshake["v"] = m_settings.get_str(settings_pack::handshake_client_version).empty()
				? m_settings.get_str(settings_pack::user_agent)
				: m_settings.get_str(settings_pack::handshake_client_version);
		}

		std::string remote_address;
		std::back_insert_iterator<std::string> out(remote_address);
		detail::write_address(remote().address(), out);
#if TORRENT_USE_I2P
		if (!is_i2p(*get_socket()))
#endif
			handshake["yourip"] = remote_address;
		handshake["reqq"] = m_settings.get_int(settings_pack::max_allowed_in_request_queue);

		m["upload_only"] = upload_only_msg;
		m["ut_holepunch"] = holepunch_msg;
#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_settings.get_bool(settings_pack::support_share_mode))
			m["share_mode"] = share_mode_msg;
#endif
		m["lt_donthave"] = dont_have_msg;

		int complete_ago = -1;
		if (t->last_seen_complete() > 0) complete_ago = t->time_since_complete();
		handshake["complete_ago"] = complete_ago;

		// if we're super seeding, don't say we're upload only, since it might
		// make peers disconnect. don't tell anyone we're upload only when in
		// share mode, we want to stay connected to seeds. if we're super seeding,
		// we don't want to make peers think that we only have a single piece and
		// is upload only, since they might disconnect immediately when they have
		// downloaded a single piece, although we'll make another piece available.
		// If we don't have metadata, we also need to suppress saying we're
		// upload-only. If we do, we may be disconnected before we receive the
		// metadata.
		if (t->is_upload_only()
#ifndef TORRENT_DISABLE_SHARE_MODE
			&& !t->share_mode()
#endif
			&& t->valid_metadata()
#ifndef TORRENT_DISABLE_SUPERSEEDING
			&& !t->super_seeding()
#endif
			)
		{
			handshake["upload_only"] = 1;
		}

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_settings.get_bool(settings_pack::support_share_mode)
			&& t->share_mode())
			handshake["share_mode"] = 1;
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		// loop backwards, to make the first extension be the last
		// to fill in the handshake (i.e. give the first extensions priority)
		for (auto const& e : m_extensions)
		{
			e->add_handshake(handshake);
		}
#endif

#ifndef NDEBUG
		// make sure there are not conflicting extensions
		std::set<int> ext;
		for (entry::dictionary_type::const_iterator i = m.begin()
			, end(m.end()); i != end; ++i)
		{
			if (i->second.type() != entry::int_t) continue;
			int val = int(i->second.integer());
			TORRENT_ASSERT(ext.find(val) == ext.end());
			ext.insert(val);
		}
#endif

		std::vector<char> dict_msg;
		bencode(std::back_inserter(dict_msg), handshake);

		char msg[6];
		char* ptr = msg;

		// write the length of the message
		detail::write_int32(int(dict_msg.size()) + 2, ptr);
		detail::write_uint8(msg_extended, ptr);
		// signal handshake message
		detail::write_uint8(0, ptr);
		send_buffer(msg);
		send_buffer(dict_msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_ext_handshake);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "EXTENDED_HANDSHAKE"
				, "%s", handshake.to_string(true).c_str());
		}
#endif
	}

	void bt_peer_connection::write_choke()
	{
		INVARIANT_CHECK;

		if (is_choked()) return;
		send_message(msg_choke, counters::num_outgoing_choke);
	}

	void bt_peer_connection::write_unchoke()
	{
		INVARIANT_CHECK;

		send_message(msg_unchoke, counters::num_outgoing_unchoke);

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			e->sent_unchoke();
		}
#endif
	}

	void bt_peer_connection::write_interested()
	{
		INVARIANT_CHECK;

		send_message(msg_interested, counters::num_outgoing_interested);
	}

	void bt_peer_connection::write_not_interested()
	{
		INVARIANT_CHECK;

		send_message(msg_not_interested, counters::num_outgoing_not_interested);
	}

	void bt_peer_connection::write_have(piece_index_t const index)
	{
		INVARIANT_CHECK;
		TORRENT_ASSERT(associated_torrent().lock()->valid_metadata());
		TORRENT_ASSERT(index >= piece_index_t(0));
		TORRENT_ASSERT(index < associated_torrent().lock()->torrent_file().end_piece());

		// if we haven't sent the bitfield yet, this piece should be included in
		// there instead
		if (!m_sent_bitfield) return;

		send_message(msg_have, counters::num_outgoing_have
			, static_cast<int>(index));
	}

	void bt_peer_connection::write_dont_have(piece_index_t const index)
	{
		INVARIANT_CHECK;
		TORRENT_ASSERT(associated_torrent().lock()->valid_metadata());
		TORRENT_ASSERT(index >= piece_index_t(0));
		TORRENT_ASSERT(index < associated_torrent().lock()->torrent_file().end_piece());

		if (in_handshake()) return;

		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(m_sent_bitfield);

		if (!m_supports_extensions || m_dont_have_id == 0) return;

		char msg[] = {0,0,0,6,msg_extended,char(m_dont_have_id),0,0,0,0};
		char* ptr = msg + 6;
		detail::write_int32(static_cast<int>(index), ptr);
		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_extended);
	}

	void bt_peer_connection::write_piece(peer_request const& r, disk_buffer_holder buffer)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(m_sent_bitfield);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		bool merkle = t->torrent_file().is_merkle_torrent() && r.start == 0;
	// the hash piece looks like this:
	// uint8_t  msg
	// uint32_t piece index
	// uint32_t start
	// uint32_t list len
	// var      bencoded list
	// var      piece data
		char msg[4 + 1 + 4 + 4 + 4];
		char* ptr = msg;
		TORRENT_ASSERT(r.length <= 16 * 1024);
		detail::write_int32(r.length + 1 + 4 + 4, ptr);
		if (m_settings.get_bool(settings_pack::support_merkle_torrents) && merkle)
			detail::write_uint8(250, ptr);
		else
			detail::write_uint8(msg_piece, ptr);
		detail::write_int32(static_cast<int>(r.piece), ptr);
		detail::write_int32(r.start, ptr);

		// if this is a merkle torrent and the start offset
		// is 0, we need to include the merkle node hashes
		if (merkle)
		{
			std::vector<char> piece_list_buf;
			entry piece_list;
			entry::list_type& l = piece_list.list();
			std::map<int, sha1_hash> merkle_node_list = t->torrent_file().build_merkle_list(r.piece);
			l.reserve(merkle_node_list.size());
			for (auto const& i : merkle_node_list)
			{
				l.emplace_back(entry::list_t);
				l.back().list().emplace_back(i.first);
				l.back().list().emplace_back(i.second.to_string());
			}
			bencode(std::back_inserter(piece_list_buf), piece_list);
			detail::write_int32(int(piece_list_buf.size()), ptr);

			// back-patch the length field
			char* ptr2 = msg;
			detail::write_int32(r.length + 1 + 4 + 4 + 4 + int(piece_list_buf.size())
				, ptr2);

			send_buffer({msg, 17});
			send_buffer(piece_list_buf);
		}
		else
		{
			send_buffer({msg, 13});
		}

		if (buffer.is_mutable())
		{
			append_send_buffer(std::move(buffer), r.length);
		}
		else
		{
			append_const_send_buffer(std::move(buffer), r.length);
		}

		m_payloads.emplace_back(send_buffer_size() - r.length, r.length);
		setup_send();

		stats_counters().inc_stats_counter(counters::num_outgoing_piece);

		if (t->alerts().should_post<block_uploaded_alert>())
		{
			t->alerts().emplace_alert<block_uploaded_alert>(t->get_handle(),
				remote(), pid(), r.start / t->block_size() , r.piece);
		}
	}

	// --------------------------
	// RECEIVE DATA
	// --------------------------

	void bt_peer_connection::on_receive(error_code const& error
		, std::size_t bytes_transferred)
	{
		INVARIANT_CHECK;

		if (error)
		{
			received_bytes(0, int(bytes_transferred));
			return;
		}

		// make sure are much as possible of the response ends up in the same
		// packet, or at least back-to-back packets
		cork c_(*this);

#if !defined TORRENT_DISABLE_ENCRYPTION
		if (!m_enc_handler.is_recv_plaintext())
		{
			int const consumed = m_enc_handler.decrypt(m_recv_buffer, bytes_transferred);
#ifndef TORRENT_DISABLE_LOGGING
			if (consumed + int(bytes_transferred) > 0)
				peer_log(peer_log_alert::incoming_message, "ENCRYPTION"
					, "decrypted block s = %d", consumed + int(bytes_transferred));
#endif
			if (bytes_transferred == SIZE_MAX)
			{
				disconnect(errors::parse_failed, operation_t::encryption);
				return;
			}
			received_bytes(0, consumed);

			// don't accept packets larger than 1 MB with a 1KB allowance for headers
			if (!m_recv_buffer.crypto_packet_finished()
				&& m_recv_buffer.crypto_packet_size() > 1025 * 1024)
			{
				disconnect(errors::packet_too_large, operation_t::encryption, peer_error);
				return;
			}

			int sub_transferred = 0;
			while (bytes_transferred > 0 &&
				((sub_transferred = m_recv_buffer.advance_pos(int(bytes_transferred))) > 0))
			{
#if TORRENT_USE_ASSERTS
				std::int64_t const cur_payload_dl = m_statistics.last_payload_downloaded();
				std::int64_t const cur_protocol_dl = m_statistics.last_protocol_downloaded();
#endif
				TORRENT_ASSERT(sub_transferred > 0);
				on_receive_impl(std::size_t(sub_transferred));
				bytes_transferred -= std::size_t(sub_transferred);

#if TORRENT_USE_ASSERTS
				TORRENT_ASSERT(m_statistics.last_payload_downloaded() - cur_payload_dl >= 0);
				TORRENT_ASSERT(m_statistics.last_protocol_downloaded() - cur_protocol_dl >= 0);
				std::int64_t const stats_diff = m_statistics.last_payload_downloaded() - cur_payload_dl +
					m_statistics.last_protocol_downloaded() - cur_protocol_dl;
				TORRENT_ASSERT(stats_diff == sub_transferred);
#endif

				if (m_disconnecting) return;
			}
		}
		else
#endif
			on_receive_impl(bytes_transferred);
	}

	void bt_peer_connection::on_receive_impl(std::size_t bytes_transferred)
	{
		std::shared_ptr<torrent> t = associated_torrent().lock();

		span<char const> recv_buffer = m_recv_buffer.get();

#if !defined TORRENT_DISABLE_ENCRYPTION
		// m_state is set to read_pe_dhkey in initial state
		// (read_protocol_identifier) for incoming, or in constructor
		// for outgoing
		if (m_state == state_t::read_pe_dhkey)
		{
			received_bytes(0, int(bytes_transferred));

			TORRENT_ASSERT(!m_encrypted);
			TORRENT_ASSERT(!m_rc4_encrypted);
			TORRENT_ASSERT(m_recv_buffer.packet_size() == dh_key_len);
			TORRENT_ASSERT(recv_buffer.data() == m_recv_buffer.get().data());
			TORRENT_ASSERT(recv_buffer.size() == m_recv_buffer.get().size());

			if (!m_recv_buffer.packet_finished()) return;

			// write our dh public key. m_dh_key_exchange is
			// initialized in write_pe1_2_dhkey()
			if (!is_outgoing()) write_pe1_2_dhkey();
			if (is_disconnecting()) return;

			// read dh key, generate shared secret
			m_dh_key_exchange->compute_secret(
				reinterpret_cast<std::uint8_t const*>(recv_buffer.data()));

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "ENCRYPTION", "received DH key");
#endif

			// PadA/B can be a max of 512 bytes, and 20 bytes more for
			// the sync hash (if incoming), or 8 bytes more for the
			// encrypted verification constant (if outgoing). Instead
			// of requesting the maximum possible, request the maximum
			// possible to ensure we do not overshoot the standard
			// handshake.

			if (is_outgoing())
			{
				m_state = state_t::read_pe_syncvc;
				write_pe3_sync();

				// initial payload is the standard handshake, this is
				// always rc4 if sent here. m_rc4_encrypted is flagged
				// again according to peer selection.
				switch_send_crypto(m_rc4);
				write_handshake();
				switch_send_crypto(std::shared_ptr<crypto_plugin>());

				// vc,crypto_select,len(pad),pad, encrypt(handshake)
				// 8+4+2+0+handshake_len
				m_recv_buffer.reset(8+4+2+0+handshake_len);
			}
			else
			{
				// already written dh key
				m_state = state_t::read_pe_synchash;
				// synchash,skeyhash,vc,crypto_provide,len(pad),pad,encrypt(handshake)
				m_recv_buffer.reset(20+20+8+4+2+0+handshake_len);
			}
			TORRENT_ASSERT(!m_recv_buffer.packet_finished());
			return;
		}

		// cannot fall through into
		if (m_state == state_t::read_pe_synchash)
		{
			TORRENT_ASSERT(!m_encrypted);
			TORRENT_ASSERT(!m_rc4_encrypted);
			TORRENT_ASSERT(!is_outgoing());
			TORRENT_ASSERT(recv_buffer.data() == m_recv_buffer.get().data());
			TORRENT_ASSERT(recv_buffer.size() == m_recv_buffer.get().size());

			if (int(recv_buffer.size()) < 20)
			{
				received_bytes(0, int(bytes_transferred));

				if (m_recv_buffer.packet_finished())
					disconnect(errors::sync_hash_not_found, operation_t::bittorrent, failure);
				return;
			}

			if (!m_sync_hash)
			{
				TORRENT_ASSERT(m_sync_bytes_read == 0);

				static char const req1[4] = {'r', 'e', 'q', '1'};
				// compute synchash (hash('req1',S))
				std::array<char, dh_key_len> const buffer = export_key(m_dh_key_exchange->get_secret());
				hasher h(req1);
				h.update(buffer);
				m_sync_hash.reset(new sha1_hash(h.final()));

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log(peer_log_alert::info))
				{
					peer_log(peer_log_alert::info, "ENCRYPTION"
						, "looking for synchash %s secret: %s"
						, aux::to_hex(*m_sync_hash).c_str()
						, aux::to_hex(buffer).c_str());
				}
#endif
			}

			int const syncoffset = search(*m_sync_hash, recv_buffer);

			// No sync
			if (syncoffset == -1)
			{
				received_bytes(0, int(bytes_transferred));

				int const bytes_processed = int(recv_buffer.size()) - 20;
				m_sync_bytes_read += bytes_processed;
				if (m_sync_bytes_read >= 512)
				{
					disconnect(errors::sync_hash_not_found, operation_t::encryption, failure);
					return;
				}

				m_recv_buffer.cut(bytes_processed, std::min(m_recv_buffer.packet_size()
					, (512 + 20) - m_sync_bytes_read));

				TORRENT_ASSERT(!m_recv_buffer.packet_finished());
				return;
			}
			// found complete sync
			else
			{
				int const bytes_processed = syncoffset + 20;
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "ENCRYPTION"
					, "sync point (hash) found at offset %d"
					, m_sync_bytes_read + bytes_processed - 20);
#endif
				m_state = state_t::read_pe_skey_vc;
				// skey,vc - 28 bytes
				m_sync_hash.reset();
				int const transferred_used = bytes_processed
					- aux::numeric_cast<int>(recv_buffer.size())
					+ aux::numeric_cast<int>(bytes_transferred);
				TORRENT_ASSERT(transferred_used >= 0);
				TORRENT_ASSERT(transferred_used <= int(bytes_transferred));
				received_bytes(0, transferred_used);
				bytes_transferred -= std::size_t(transferred_used);
				m_recv_buffer.cut(bytes_processed, 28);
			}
		}

		if (m_state == state_t::read_pe_skey_vc)
		{
			received_bytes(0, int(bytes_transferred));
			bytes_transferred = 0;

			TORRENT_ASSERT(!m_encrypted);
			TORRENT_ASSERT(!m_rc4_encrypted);
			TORRENT_ASSERT(!is_outgoing());
			TORRENT_ASSERT(m_recv_buffer.packet_size() == 28);

			if (!m_recv_buffer.packet_finished()) return;
			if (is_disconnecting()) return;
			TORRENT_ASSERT(!is_disconnecting());

			recv_buffer = m_recv_buffer.get();

			TORRENT_ASSERT(!is_disconnecting());

			sha1_hash ih(recv_buffer.data());
			torrent const* ti = m_ses.find_encrypted_torrent(ih, m_dh_key_exchange->get_hash_xor_mask());

			if (ti)
			{
				if (!t)
				{
					attach_to_torrent(ti->info_hash());
					if (is_disconnecting()) return;
					TORRENT_ASSERT(!is_disconnecting());

					t = associated_torrent().lock();
					TORRENT_ASSERT(t);
				}

				m_rc4 = init_pe_rc4_handler(m_dh_key_exchange->get_secret()
					, ti->info_hash(), is_outgoing());
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "ENCRYPTION", "computed RC4 keys");
				peer_log(peer_log_alert::info, "ENCRYPTION", "stream key found, torrent located");
#endif
			}

			if (!m_rc4)
			{
				disconnect(errors::invalid_info_hash, operation_t::bittorrent, failure);
				return;
			}

			// verify constant
			rc4_decrypt(m_recv_buffer.mutable_buffer().subspan(20, 8));

			static const char sh_vc[] = {0,0,0,0, 0,0,0,0};
			if (!std::equal(sh_vc, sh_vc + 8, recv_buffer.begin() + 20))
			{
				disconnect(errors::invalid_encryption_constant, operation_t::encryption, peer_error);
				return;
			}

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "ENCRYPTION", "verification constant found");
#endif
			m_state = state_t::read_pe_cryptofield;
			m_recv_buffer.reset(4 + 2);
		}

		// cannot fall through into
		if (m_state == state_t::read_pe_syncvc)
		{
			TORRENT_ASSERT(is_outgoing());
			TORRENT_ASSERT(!m_encrypted);
			TORRENT_ASSERT(!m_rc4_encrypted);
			TORRENT_ASSERT(recv_buffer.data() == m_recv_buffer.get().data());
			TORRENT_ASSERT(recv_buffer.size() == m_recv_buffer.get().size());

			if (int(recv_buffer.size()) < 8)
			{
				received_bytes(0, int(bytes_transferred));
				if (m_recv_buffer.packet_finished())
					disconnect(errors::invalid_encryption_constant, operation_t::encryption, peer_error);
				return;
			}

			// generate the verification constant
			if (!m_sync_vc)
			{
				TORRENT_ASSERT(m_sync_bytes_read == 0);

				m_sync_vc.reset(new (std::nothrow) char[8]);
				if (!m_sync_vc)
				{
					disconnect(errors::no_memory, operation_t::encryption);
					return;
				}
				std::fill(m_sync_vc.get(), m_sync_vc.get() + 8, char{0});
				rc4_decrypt({m_sync_vc.get(), 8});
			}

			TORRENT_ASSERT(m_sync_vc);
			int const syncoffset = search({m_sync_vc.get(), 8}, recv_buffer);

			// No sync
			if (syncoffset == -1)
			{
				int const bytes_processed = int(recv_buffer.size()) - 8;
				m_sync_bytes_read += bytes_processed;
				received_bytes(0, int(bytes_transferred));

				if (m_sync_bytes_read >= 512)
				{
					disconnect(errors::invalid_encryption_constant, operation_t::encryption, peer_error);
					return;
				}

				m_recv_buffer.cut(bytes_processed, std::min(m_recv_buffer.packet_size()
					, (512 + 8) - m_sync_bytes_read));

				TORRENT_ASSERT(!m_recv_buffer.packet_finished());
			}
			// found complete sync
			else
			{
				int const bytes_processed = syncoffset + 8;
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "ENCRYPTION"
					, "sync point (verification constant) found at offset %d"
					, m_sync_bytes_read + bytes_processed - 8);
#endif
				int const transferred_used = bytes_processed
					- aux::numeric_cast<int>(recv_buffer.size())
					+ aux::numeric_cast<int>(bytes_transferred);
				TORRENT_ASSERT(transferred_used >= 0);
				TORRENT_ASSERT(transferred_used <= int(bytes_transferred));
				received_bytes(0, transferred_used);
				bytes_transferred -= std::size_t(transferred_used);

				m_recv_buffer.cut(bytes_processed, 4 + 2);

				// delete verification constant
				m_sync_vc.reset();
				m_state = state_t::read_pe_cryptofield;
				// fall through
			}
		}

		if (m_state == state_t::read_pe_cryptofield) // local/remote
		{
			TORRENT_ASSERT(!m_encrypted);
			TORRENT_ASSERT(!m_rc4_encrypted);
			TORRENT_ASSERT(m_recv_buffer.packet_size() == 4+2);
			received_bytes(0, int(bytes_transferred));
			bytes_transferred = 0;

			if (!m_recv_buffer.packet_finished()) return;

			rc4_decrypt(m_recv_buffer.mutable_buffer().first(
				m_recv_buffer.packet_size()));

			recv_buffer = m_recv_buffer.get();

			std::uint32_t crypto_field = aux::read_uint32(recv_buffer);

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "ENCRYPTION", "crypto %s : [%s%s ]"
				, is_outgoing() ? "select" : "provide"
				, (crypto_field & 1) ? " plaintext" : ""
				, (crypto_field & 2) ? " rc4" : "");
#endif

			if (!is_outgoing())
			{
				// select a crypto method
				int allowed_encryption = m_settings.get_int(settings_pack::allowed_enc_level);
				std::uint32_t crypto_select = crypto_field & std::uint32_t(allowed_encryption);

				// when prefer_rc4 is set, keep the most significant bit
				// otherwise keep the least significant one
				if (m_settings.get_bool(settings_pack::prefer_rc4))
				{
					std::uint32_t mask = std::numeric_limits<std::uint32_t>::max();
					while (crypto_select & (mask << 1))
					{
						mask <<= 1;
						crypto_select = crypto_select & mask;
					}
				}
				else
				{
					std::uint32_t mask = std::numeric_limits<std::uint32_t>::max();
					while (crypto_select & (mask >> 1))
					{
						mask >>= 1;
						crypto_select = crypto_select & mask;
					}
				}

				if (crypto_select == 0)
				{
					disconnect(errors::unsupported_encryption_mode, operation_t::encryption, failure);
					return;
				}

				// write the pe4 step
				write_pe4_sync(aux::numeric_cast<int>(crypto_select));
			}
			else // is_outgoing()
			{
				// check if crypto select is valid
				int allowed_encryption = m_settings.get_int(settings_pack::allowed_enc_level);

				crypto_field &= std::uint32_t(allowed_encryption);
				if (crypto_field == 0)
				{
					// we don't allow any of the offered encryption levels
					disconnect(errors::unsupported_encryption_mode_selected, operation_t::encryption, peer_error);
					return;
				}

				if (crypto_field == settings_pack::pe_plaintext)
					m_rc4_encrypted = false;
				else if (crypto_field == settings_pack::pe_rc4)
					m_rc4_encrypted = true;
			}

			int const len_pad = aux::read_int16(recv_buffer);
			if (len_pad < 0 || len_pad > 512)
			{
				disconnect(errors::invalid_pad_size, operation_t::encryption, peer_error);
				return;
			}

			m_state = state_t::read_pe_pad;
			if (!is_outgoing())
				m_recv_buffer.reset(len_pad + 2); // len(IA) at the end of pad
			else
			{
				if (len_pad == 0)
				{
					m_encrypted = true;
					if (m_rc4_encrypted)
					{
						switch_send_crypto(m_rc4);
						switch_recv_crypto(m_rc4);
					}
					m_state = state_t::init_bt_handshake;
				}
				else
					m_recv_buffer.reset(len_pad);
			}
		}

		if (m_state == state_t::read_pe_pad)
		{
			TORRENT_ASSERT(!m_encrypted);
			received_bytes(0, int(bytes_transferred));
			bytes_transferred = 0;
			if (!m_recv_buffer.packet_finished()) return;

			int const pad_size = is_outgoing() ? m_recv_buffer.packet_size() : m_recv_buffer.packet_size() - 2;

			rc4_decrypt(m_recv_buffer.mutable_buffer().first(m_recv_buffer.packet_size()));

			recv_buffer = m_recv_buffer.get();

			if (!is_outgoing())
			{
				recv_buffer = recv_buffer.subspan(pad_size);
				int const len_ia = aux::read_int16(recv_buffer);

				if (len_ia < 0)
				{
					disconnect(errors::invalid_encrypt_handshake, operation_t::encryption, peer_error);
					return;
				}

#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "ENCRYPTION", "len(IA) : %d", len_ia);
#endif
				if (len_ia == 0)
				{
					// everything after this is Encrypt2
					m_encrypted = true;
					if (m_rc4_encrypted)
					{
						switch_send_crypto(m_rc4);
						switch_recv_crypto(m_rc4);
					}
					m_state = state_t::init_bt_handshake;
				}
				else
				{
					m_state = state_t::read_pe_ia;
					m_recv_buffer.reset(len_ia);
				}
			}
			else // is_outgoing()
			{
				// everything that arrives after this is Encrypt2
				m_encrypted = true;
				if (m_rc4_encrypted)
				{
					switch_send_crypto(m_rc4);
					switch_recv_crypto(m_rc4);
				}
				m_state = state_t::init_bt_handshake;
			}
		}

		if (m_state == state_t::read_pe_ia)
		{
			received_bytes(0, int(bytes_transferred));
			bytes_transferred = 0;
			TORRENT_ASSERT(!is_outgoing());
			TORRENT_ASSERT(!m_encrypted);

			if (!m_recv_buffer.packet_finished()) return;

			// ia is always rc4, so decrypt it
			rc4_decrypt(m_recv_buffer.mutable_buffer().first(m_recv_buffer.packet_size()));

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "ENCRYPTION"
				, "decrypted ia : %d bytes", m_recv_buffer.packet_size());
#endif

			// everything that arrives after this is encrypted
			m_encrypted = true;
			if (m_rc4_encrypted)
			{
				switch_send_crypto(m_rc4);
				switch_recv_crypto(m_rc4);
			}
			m_rc4.reset();

			m_state = state_t::read_protocol_identifier;
			m_recv_buffer.cut(0, 20);
		}

		if (m_state == state_t::init_bt_handshake)
		{
			received_bytes(0, int(bytes_transferred));
			bytes_transferred = 0;
			TORRENT_ASSERT(m_encrypted);

			// decrypt remaining received bytes
			if (m_rc4_encrypted)
			{
				span<char> const remaining = m_recv_buffer.mutable_buffer()
					.subspan(m_recv_buffer.packet_size());
				rc4_decrypt(remaining);

#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "ENCRYPTION"
					, "decrypted remaining %d bytes", int(remaining.size()));
#endif
			}
			m_rc4.reset();

			// payload stream, start with 20 handshake bytes
			m_state = state_t::read_protocol_identifier;
			m_recv_buffer.reset(20);

			// encrypted portion of handshake completed, toggle
			// peer_info pe_support flag back to true
			if (is_outgoing() &&
				m_settings.get_int(settings_pack::out_enc_policy)
					== settings_pack::pe_enabled)
			{
				torrent_peer* pi = peer_info_struct();
				TORRENT_ASSERT(pi);

				pi->pe_support = true;
			}
		}

#endif // #if !defined TORRENT_DISABLE_ENCRYPTION

		if (m_state == state_t::read_protocol_identifier)
		{
			received_bytes(0, int(bytes_transferred));
			bytes_transferred = 0;
			TORRENT_ASSERT(m_recv_buffer.packet_size() == 20);

			if (!m_recv_buffer.packet_finished()) return;
			recv_buffer = m_recv_buffer.get();

			int const packet_size = recv_buffer[0];
			static const char protocol_string[] = "\x13" "BitTorrent protocol";

			if (packet_size != 19 ||
				recv_buffer.first(20) != span<char const>{protocol_string, 20})
			{
#if !defined TORRENT_DISABLE_ENCRYPTION
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "ENCRYPTION"
					, "unrecognized protocol header");
#endif

#ifdef TORRENT_USE_OPENSSL
				if (is_ssl(*get_socket()))
				{
#ifndef TORRENT_DISABLE_LOGGING
					peer_log(peer_log_alert::info, "ENCRYPTION"
						, "SSL peers are not allowed to use any other encryption");
#endif
					disconnect(errors::invalid_info_hash, operation_t::bittorrent, failure);
					return;
				}
#endif // TORRENT_USE_OPENSSL

				if (!is_outgoing()
					&& m_settings.get_int(settings_pack::in_enc_policy)
						== settings_pack::pe_disabled)
				{
					disconnect(errors::no_incoming_encrypted, operation_t::bittorrent);
					return;
				}

				// Don't attempt to perform an encrypted handshake
				// within an encrypted connection. For local connections,
				// we're expected to already have passed the encrypted
				// handshake by this point
				if (m_encrypted || is_outgoing())
				{
					disconnect(errors::invalid_info_hash, operation_t::bittorrent, failure);
					return;
				}

#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "ENCRYPTION", "attempting encrypted connection");
#endif
				m_state = state_t::read_pe_dhkey;
				m_recv_buffer.cut(0, dh_key_len);
				TORRENT_ASSERT(!m_recv_buffer.packet_finished());
				return;
#else
				disconnect(errors::invalid_info_hash, operation_t::bittorrent, failure);
				return;
#endif // TORRENT_DISABLE_ENCRYPTION
			}
			else
			{
#if !defined TORRENT_DISABLE_ENCRYPTION
				TORRENT_ASSERT(m_state != state_t::read_pe_dhkey);

				if (!is_outgoing()
					&& m_settings.get_int(settings_pack::in_enc_policy)
						== settings_pack::pe_forced
					&& !m_encrypted
					&& !is_ssl(*get_socket()))
				{
					disconnect(errors::no_incoming_regular, operation_t::bittorrent);
					return;
				}
#endif

#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "HANDSHAKE", "BitTorrent protocol");
#endif
			}

			m_state = state_t::read_info_hash;
			m_recv_buffer.reset(28);
		}

		// fall through
		if (m_state == state_t::read_info_hash)
		{
			received_bytes(0, int(bytes_transferred));
			bytes_transferred = 0;
			TORRENT_ASSERT(m_recv_buffer.packet_size() == 28);

			if (!m_recv_buffer.packet_finished()) return;
			recv_buffer = m_recv_buffer.get();

#ifndef TORRENT_DISABLE_LOGGING
			std::string extensions;
			extensions.reserve(8 * 8);
			for (int i = 0; i < 8; ++i)
				for (int j = 0; j < 8; ++j)
					extensions += (recv_buffer[i] & (0x80 >> j)) ? '1' : '0';

			if (should_log(peer_log_alert::incoming_message))
			{
				peer_log(peer_log_alert::incoming_message, "EXTENSIONS", "%s ext: %s%s%s"
					, extensions.c_str()
					, (recv_buffer[7] & 0x01) ? "DHT " : ""
					, (recv_buffer[7] & 0x04) ? "FAST " : ""
					, (recv_buffer[5] & 0x10) ? "extension " : "");
			}
#endif

			std::memcpy(m_reserved_bits.data(), recv_buffer.data(), 8);
			if (recv_buffer[5] & 0x10)
				m_supports_extensions = true;

			if (recv_buffer[7] & 0x01)
				m_supports_dht_port = true;

			if (recv_buffer[7] & 0x04)
				m_supports_fast = true;

			t = associated_torrent().lock();

			// ok, now we have got enough of the handshake. Is this connection
			// attached to a torrent?
			if (!t)
			{
				// now, we have to see if there's a torrent with the
				// info_hash we got from the peer
				sha1_hash info_hash;
				std::copy(recv_buffer.begin() + 8, recv_buffer.begin() + 28
					, info_hash.data());

				attach_to_torrent(info_hash);
				if (is_disconnecting()) return;
			}
			else
			{
				// verify info hash
				if (!std::equal(recv_buffer.begin() + 8, recv_buffer.begin() + 28
					, t->torrent_file().info_hash().data()))
				{
#ifndef TORRENT_DISABLE_LOGGING
					peer_log(peer_log_alert::info, "ERROR", "received invalid info_hash");
#endif
					disconnect(errors::invalid_info_hash, operation_t::bittorrent, failure);
					return;
				}

#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming, "HANDSHAKE", "info_hash received");
#endif
			}

			t = associated_torrent().lock();
			TORRENT_ASSERT(t);

			// if this is a local connection, we have already
			// sent the handshake
			if (!is_outgoing()) write_handshake();
			TORRENT_ASSERT(m_sent_handshake);

			if (is_disconnecting()) return;

			m_state = state_t::read_peer_id;
			m_recv_buffer.reset(20);
		}

		// fall through
		if (m_state == state_t::read_peer_id)
		{
			TORRENT_ASSERT(m_sent_handshake);
			received_bytes(0, int(bytes_transferred));

			t = associated_torrent().lock();
			if (!t)
			{
				TORRENT_ASSERT(!m_recv_buffer.packet_finished()); // TODO
				return;
			}
			TORRENT_ASSERT(m_recv_buffer.packet_size() == 20);

			if (!m_recv_buffer.packet_finished()) return;
			recv_buffer = m_recv_buffer.get();

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::incoming))
			{
				char hex_pid[41];
				aux::to_hex({recv_buffer.data(), 20}, hex_pid);
				hex_pid[40] = 0;
				char ascii_pid[21];
				ascii_pid[20] = 0;
				for (int i = 0; i != 20; ++i)
					ascii_pid[i] = (is_print(recv_buffer[i])) ? recv_buffer[i] : '.';

				peer_log(peer_log_alert::incoming, "HANDSHAKE", "received peer_id: %s client: %s ascii: \"%s\""
					, hex_pid, identify_client(peer_id(recv_buffer.data())).c_str(), ascii_pid);
			}
#endif
			peer_id pid;
			std::copy(recv_buffer.begin(), recv_buffer.begin() + 20, pid.data());

			if (t->settings().get_bool(settings_pack::allow_multiple_connections_per_ip))
			{
				// now, let's see if this connection should be closed
				peer_connection* p = t->find_peer(pid);
				if (p)
				{
					TORRENT_ASSERT(p->pid() == pid);
					// we found another connection with the same peer-id
					// which connection should be closed in order to be
					// sure that the other end closes the same connection?
					// the peer with greatest peer-id is the one allowed to
					// initiate connections. So, if our peer-id is greater than
					// the others, we should close the incoming connection,
					// if not, we should close the outgoing one.
					if ((pid < m_our_peer_id) == is_outgoing())
					{
						p->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					}
					else
					{
						disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return;
					}
				}
			}

			set_pid(pid);
			m_client_version = identify_client(pid);
			if (pid[0] == '-' && pid[1] == 'B' && pid[2] == 'C' && pid[7] == '-')
			{
				// if this is a bitcomet client, lower the request queue size limit
				if (max_out_request_queue() > 50) max_out_request_queue(50);
			}

			if (t->is_self_connection(pid))
			{
				disconnect(errors::self_connection, operation_t::bittorrent);
				return;
			}

#ifndef TORRENT_DISABLE_EXTENSIONS
			for (auto i = m_extensions.begin()
				, end(m_extensions.end()); i != end;)
			{
				if (!(*i)->on_handshake(m_reserved_bits))
				{
					i = m_extensions.erase(i);
				}
				else
				{
					++i;
				}
			}
			if (is_disconnecting()) return;
#endif

			if (m_supports_extensions) write_extensions();

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "HANDSHAKE", "connection ready");
#endif
			// consider this a successful connection, reset the failcount
			if (peer_info_struct())
				t->clear_failcount(peer_info_struct());

#if !defined TORRENT_DISABLE_ENCRYPTION
			// Toggle pe_support back to false if this is a
			// standard successful connection
			if (is_outgoing() && !m_encrypted &&
				m_settings.get_int(settings_pack::out_enc_policy)
					== settings_pack::pe_enabled)
			{
				torrent_peer* pi = peer_info_struct();
				TORRENT_ASSERT(pi);

				pi->pe_support = false;
			}
#endif

			// complete the handshake
			// we don't know how many pieces there are until we
			// have the metadata
			if (t->ready_for_connections())
			{
				write_bitfield();
				write_dht_port();

				// if we don't have any pieces, don't do any preemptive
				// unchoking at all.
				if (t->num_have() > 0)
				{
					// if the peer is ignoring unchoke slots, or if we have enough
					// unused slots, unchoke this peer right away, to save a round-trip
					// in case it's interested.
					maybe_unchoke_this_peer();
				}
			}

			m_state = state_t::read_packet_size;
			m_recv_buffer.reset(5);

			TORRENT_ASSERT(!m_recv_buffer.packet_finished());
			return;
		}

		// cannot fall through into
		if (m_state == state_t::read_packet_size)
		{
			// Make sure this is not fallen though into
			TORRENT_ASSERT(recv_buffer.data() == m_recv_buffer.get().data());
			TORRENT_ASSERT(recv_buffer.size() == m_recv_buffer.get().size());
			TORRENT_ASSERT(m_recv_buffer.packet_size() == 5);

			if (!t) return;

			// the 5th byte (if one) should not count as protocol
			// byte here, instead it's counted in the message
			// handler itself, for the specific message
			TORRENT_ASSERT(bytes_transferred <= 5);
			int used_bytes = int(recv_buffer.size()) > 4 ? int(bytes_transferred) - 1: int(bytes_transferred);
			received_bytes(0, used_bytes);
			bytes_transferred -= aux::numeric_cast<std::size_t>(used_bytes);
			if (int(recv_buffer.size()) < 4) return;

			TORRENT_ASSERT(bytes_transferred <= 1);

			const char* ptr = recv_buffer.data();
			int const packet_size = detail::read_int32(ptr);

			// don't accept packets larger than 1 MB
			if (packet_size > 1024 * 1024 || packet_size < 0)
			{
				// packet too large
				received_bytes(0, int(bytes_transferred));
				disconnect(errors::packet_too_large, operation_t::bittorrent, peer_error);
				return;
			}

			if (packet_size == 0)
			{
				TORRENT_ASSERT(bytes_transferred <= 1);
				received_bytes(0, int(bytes_transferred));
				incoming_keepalive();
				if (is_disconnecting()) return;
				// keepalive message
				m_state = state_t::read_packet_size;
				m_recv_buffer.cut(4, 5);
				return;
			}
			if (int(recv_buffer.size()) < 5) return;

			m_state = state_t::read_packet;
			m_recv_buffer.cut(4, packet_size);
			recv_buffer = m_recv_buffer.get();
			TORRENT_ASSERT(int(recv_buffer.size()) == 1);
			TORRENT_ASSERT(bytes_transferred == 1);
		}

		if (m_state == state_t::read_packet)
		{
			TORRENT_ASSERT(recv_buffer.data() == m_recv_buffer.get().data());
			TORRENT_ASSERT(recv_buffer.size() == m_recv_buffer.get().size());
			if (!t)
			{
				received_bytes(0, int(bytes_transferred));
				disconnect(errors::torrent_removed, operation_t::bittorrent, failure);
				return;
			}
#if TORRENT_USE_ASSERTS
			std::int64_t const cur_payload_dl = statistics().last_payload_downloaded();
			std::int64_t const cur_protocol_dl = statistics().last_protocol_downloaded();
#endif
			if (dispatch_message(int(bytes_transferred)))
			{
				m_state = state_t::read_packet_size;
				m_recv_buffer.reset(5);
			}

#if TORRENT_USE_ASSERTS
			TORRENT_ASSERT(statistics().last_payload_downloaded() - cur_payload_dl >= 0);
			TORRENT_ASSERT(statistics().last_protocol_downloaded() - cur_protocol_dl >= 0);
			std::int64_t const stats_diff = statistics().last_payload_downloaded() - cur_payload_dl +
				statistics().last_protocol_downloaded() - cur_protocol_dl;
			TORRENT_ASSERT(stats_diff == std::int64_t(bytes_transferred));
			TORRENT_ASSERT(!m_recv_buffer.packet_finished());
#endif
			return;
		}

		TORRENT_ASSERT(!m_recv_buffer.packet_finished());
	}

#if !defined TORRENT_DISABLE_ENCRYPTION
	std::tuple<int, span<span<char const>>>
	bt_peer_connection::hit_send_barrier(
		span<span<char>> iovec)
	{
		int next_barrier;
		span<span<char const>> out_iovec;
		std::tie(next_barrier, out_iovec) = m_enc_handler.encrypt(iovec);
#ifndef TORRENT_DISABLE_LOGGING
		if (next_barrier != 0)
			peer_log(peer_log_alert::outgoing, "SEND_BARRIER"
				, "encrypted block s = %d", next_barrier);
#endif
		return std::make_tuple(next_barrier, out_iovec);
	}
#endif

	// --------------------------
	// SEND DATA
	// --------------------------

	void bt_peer_connection::on_sent(error_code const& error
		, std::size_t const bytes_transferred)
	{
		INVARIANT_CHECK;

		if (error)
		{
			sent_bytes(0, int(bytes_transferred));
			return;
		}

		// manage the payload markers
		int amount_payload = 0;
		if (!m_payloads.empty())
		{
			// this points to the first entry to not erase. i.e.
			// [begin, first_to_keep) will be erased because
			// the payload ranges they represent have been sent
			auto first_to_keep = m_payloads.begin();

			for (auto i = m_payloads.begin(); i != m_payloads.end(); ++i)
			{
				i->start -= int(bytes_transferred);
				if (i->start < 0)
				{
					if (i->start + i->length <= 0)
					{
						amount_payload += i->length;
						TORRENT_ASSERT(first_to_keep == i);
						++first_to_keep;
					}
					else
					{
						amount_payload += -i->start;
						i->length -= -i->start;
						i->start = 0;
					}
				}
			}

			// remove all payload ranges that have been sent
			m_payloads.erase(m_payloads.begin(), first_to_keep);
		}

		TORRENT_ASSERT(amount_payload <= int(bytes_transferred));
		sent_bytes(amount_payload, int(bytes_transferred) - amount_payload);

		if (amount_payload > 0)
		{
			std::shared_ptr<torrent> t = associated_torrent().lock();
			TORRENT_ASSERT(t);
			if (t) t->update_last_upload();
		}
	}

#if TORRENT_USE_INVARIANT_CHECKS
	void bt_peer_connection::check_invariant() const
	{
		std::shared_ptr<torrent> t = associated_torrent().lock();

#if !defined TORRENT_DISABLE_ENCRYPTION
		TORRENT_ASSERT( (bool(m_state != state_t::read_pe_dhkey) || m_dh_key_exchange.get())
				|| !is_outgoing());

		TORRENT_ASSERT(!m_rc4_encrypted || (!m_encrypted && m_rc4)
			|| (m_encrypted && !m_enc_handler.is_send_plaintext()));
#endif
		if (!in_handshake())
		{
			TORRENT_ASSERT(m_sent_handshake);
		}

		if (!m_payloads.empty())
		{
			for (std::vector<range>::const_iterator i = m_payloads.begin();
				i != m_payloads.end() - 1; ++i)
			{
				TORRENT_ASSERT(i->start + i->length <= (i+1)->start);
			}
		}
	}
#endif

}